

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O3

int32_t argv2int(jit_State *J,TValue *o)

{
  int iVar1;
  lua_Number lVar2;
  
  lVar2 = o->n;
  if (0xfffffffffffffff2 < (ulong)((long)lVar2 >> 0x2f)) {
    if (((long)lVar2 >> 0x2f != 0xfffffffffffffffb) ||
       (iVar1 = lj_strscan_num((GCstr *)((ulong)lVar2 & 0x7fffffffffff),o), iVar1 == 0)) {
      lj_trace_err(J,LJ_TRERR_BADTYPE);
    }
    lVar2 = o->n;
  }
  return (int)lVar2;
}

Assistant:

static int32_t argv2int(jit_State *J, TValue *o)
{
  if (!lj_strscan_numberobj(o))
    lj_trace_err(J, LJ_TRERR_BADTYPE);
  return tvisint(o) ? intV(o) : lj_num2int(numV(o));
}